

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_cStreamStage ZVar1;
  U32 UVar2;
  void *pvVar3;
  void *pvVar4;
  ZSTD_bufferMode_e ZVar5;
  ulong uVar6;
  void *pvVar7;
  size_t sVar8;
  ulong uVar9;
  char *dst;
  size_t srcSize;
  char *dst_00;
  bool bVar10;
  size_t err_code;
  ulong uVar11;
  size_t sVar12;
  void *local_70;
  
  if (output->size < output->pos) {
    return 0xffffffffffffffba;
  }
  if (input->size < input->pos) {
    return 0xffffffffffffffb8;
  }
  if (ZSTD_e_end < endOp) {
    return 0xffffffffffffffd6;
  }
  if (cctx->streamStage == zcss_init) {
    sVar12 = ZSTD_CCtx_init_compressStream2(cctx,endOp,input->size);
    if (0xffffffffffffff88 < sVar12) {
      return sVar12;
    }
    ZVar5 = (cctx->appliedParams).inBufferMode;
    if (ZVar5 == ZSTD_bm_stable) {
      (cctx->expectedInBuffer).pos = input->pos;
      sVar12 = input->size;
      (cctx->expectedInBuffer).src = input->src;
      (cctx->expectedInBuffer).size = sVar12;
    }
    if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
      cctx->expectedOutBufferSize = output->size - output->pos;
    }
  }
  else {
    ZVar5 = (cctx->appliedParams).inBufferMode;
  }
  if (ZVar5 == ZSTD_bm_stable) {
    if ((cctx->expectedInBuffer).src != input->src) {
      return 0xffffffffffffff97;
    }
    if ((cctx->expectedInBuffer).pos != input->pos) {
      return 0xffffffffffffff97;
    }
    if (endOp != ZSTD_e_end) {
      return 0xffffffffffffff97;
    }
    if ((cctx->expectedInBuffer).size != input->size) {
      return 0xffffffffffffff97;
    }
  }
  sVar12 = output->size;
  if (((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) &&
     (cctx->expectedOutBufferSize != sVar12 - output->pos)) {
    return 0xffffffffffffff98;
  }
  pvVar3 = input->src;
  pvVar7 = (void *)(input->size + (long)pvVar3);
  local_70 = (void *)(input->pos + (long)pvVar3);
  pvVar4 = output->dst;
  dst_00 = (char *)(output->pos + (long)pvVar4);
LAB_006ce84e:
  do {
    ZVar1 = cctx->streamStage;
    do {
      if (ZVar1 == zcss_init) {
        return 0xffffffffffffffc2;
      }
      if (ZVar1 == zcss_load) {
        if (endOp == ZSTD_e_end) {
          sVar8 = (long)pvVar4 + (sVar12 - (long)dst_00);
          srcSize = (long)pvVar7 - (long)local_70;
          uVar11 = (ulong)(0x20000U - (int)srcSize >> 0xb);
          if (0x1ffff < srcSize) {
            uVar11 = 0;
          }
          if (((uVar11 + (srcSize >> 8) + srcSize <= sVar8) ||
              ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable)) && (cctx->inBuffPos == 0)) {
            sVar12 = ZSTD_compressEnd(cctx,dst_00,sVar8,local_70,srcSize);
            if (0xffffffffffffff88 < sVar12) {
              return sVar12;
            }
            dst_00 = dst_00 + sVar12;
            cctx->frameEnded = 1;
            local_70 = pvVar7;
            goto LAB_006ceca9;
          }
        }
        if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
          sVar8 = cctx->inBuffPos;
          uVar6 = cctx->inBuffTarget - sVar8;
          uVar11 = (long)pvVar7 - (long)local_70;
          if (uVar6 < (ulong)((long)pvVar7 - (long)local_70)) {
            uVar11 = uVar6;
          }
          if (uVar11 != 0) {
            memcpy(cctx->inBuff + sVar8,local_70,uVar11);
            sVar8 = cctx->inBuffPos;
          }
          uVar6 = sVar8 + uVar11;
          cctx->inBuffPos = uVar6;
          local_70 = (void *)((long)local_70 + uVar11);
          if (endOp == ZSTD_e_flush) {
            if (uVar6 == cctx->inToCompress) goto LAB_006cec43;
          }
          else if ((endOp == ZSTD_e_continue) && (uVar6 < cctx->inBuffTarget)) goto LAB_006cec43;
          sVar8 = (long)pvVar4 + (sVar12 - (long)dst_00);
          if ((cctx->appliedParams).inBufferMode != ZSTD_bm_buffered) goto LAB_006ce97f;
          uVar6 = uVar6 - cctx->inToCompress;
          bVar10 = true;
        }
        else {
          sVar8 = (long)pvVar4 + (sVar12 - (long)dst_00);
LAB_006ce97f:
          uVar6 = (long)pvVar7 - (long)local_70;
          if (cctx->blockSize <= (ulong)((long)pvVar7 - (long)local_70)) {
            uVar6 = cctx->blockSize;
          }
          bVar10 = false;
        }
        uVar11 = (ulong)(0x20000U - (int)uVar6 >> 0xb);
        if (0x1ffff < uVar6) {
          uVar11 = 0;
        }
        dst = dst_00;
        if ((sVar8 < uVar11 + (uVar6 >> 8) + uVar6) &&
           ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) {
          sVar8 = cctx->outBuffSize;
          dst = cctx->outBuff;
        }
        if (bVar10) {
          bVar10 = local_70 == pvVar7 && endOp == ZSTD_e_end;
          if (local_70 == pvVar7 && endOp == ZSTD_e_end) {
            uVar11 = ZSTD_compressEnd(cctx,dst,sVar8,cctx->inBuff + cctx->inToCompress,uVar6);
          }
          else {
            uVar11 = ZSTD_compressContinue_internal
                               (cctx,dst,sVar8,cctx->inBuff + cctx->inToCompress,uVar6,1,0);
          }
          if (0xffffffffffffff88 < uVar11) {
            return uVar11;
          }
          cctx->frameEnded = (uint)bVar10;
          sVar8 = cctx->inBuffPos;
          uVar6 = cctx->blockSize + sVar8;
          cctx->inBuffTarget = uVar6;
          if (cctx->inBuffSize < uVar6) {
            cctx->inBuffPos = 0;
            cctx->inBuffTarget = cctx->blockSize;
            sVar8 = 0;
          }
          cctx->inToCompress = sVar8;
        }
        else {
          bVar10 = (void *)((long)local_70 + uVar6) == pvVar7;
          if (bVar10) {
            uVar11 = ZSTD_compressEnd(cctx,dst,sVar8,local_70,uVar6);
          }
          else {
            uVar11 = ZSTD_compressContinue_internal(cctx,dst,sVar8,local_70,uVar6,1,0);
          }
          if (0xffffffffffffff88 < uVar11) {
            return uVar11;
          }
          cctx->frameEnded = (uint)bVar10;
          local_70 = (void *)((long)local_70 + uVar6);
        }
        if (dst != dst_00) {
          cctx->outBuffContentSize = uVar11;
          cctx->outBuffFlushedSize = 0;
          cctx->streamStage = zcss_flush;
          sVar8 = 0;
          goto LAB_006ceb24;
        }
        dst_00 = dst_00 + uVar11;
        if (!bVar10) goto LAB_006ce84e;
        goto LAB_006ceca9;
      }
    } while (ZVar1 != zcss_flush);
    uVar11 = cctx->outBuffContentSize;
    sVar8 = cctx->outBuffFlushedSize;
LAB_006ceb24:
    uVar11 = uVar11 - sVar8;
    uVar9 = (long)pvVar4 + (sVar12 - (long)dst_00);
    uVar6 = uVar11;
    if (uVar9 < uVar11) {
      uVar6 = uVar9;
    }
    if (uVar6 != 0) {
      memcpy(dst_00,cctx->outBuff + sVar8,uVar6);
      sVar8 = cctx->outBuffFlushedSize;
    }
    dst_00 = dst_00 + uVar6;
    cctx->outBuffFlushedSize = sVar8 + uVar6;
    if (uVar9 < uVar11) {
LAB_006cec43:
      UVar2 = cctx->frameEnded;
      input->pos = (long)local_70 - (long)pvVar3;
      output->pos = (long)dst_00 - (long)pvVar4;
      if (UVar2 == 0) {
        sVar12 = cctx->inBuffTarget - cctx->inBuffPos;
        if (sVar12 == 0) {
          sVar12 = cctx->blockSize;
        }
        if (0xffffffffffffff88 < sVar12) {
          return sVar12;
        }
      }
      goto LAB_006cecd0;
    }
    cctx->outBuffContentSize = 0;
    cctx->outBuffFlushedSize = 0;
    if (cctx->frameEnded != 0) {
LAB_006ceca9:
      cctx->streamStage = zcss_init;
      cctx->pledgedSrcSizePlusOne = 0;
      input->pos = (long)local_70 - (long)pvVar3;
      output->pos = (long)dst_00 - (long)pvVar4;
LAB_006cecd0:
      if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
        (cctx->expectedInBuffer).pos = input->pos;
        sVar12 = input->size;
        (cctx->expectedInBuffer).src = input->src;
        (cctx->expectedInBuffer).size = sVar12;
      }
      if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
        cctx->expectedOutBufferSize = output->size - output->pos;
      }
      return cctx->outBuffContentSize - cctx->outBuffFlushedSize;
    }
    cctx->streamStage = zcss_load;
  } while( true );
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, input->size), "CompressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);    /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}